

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
Geometry<unsigned_long*,unsigned_long_const*>
          (Geometry<std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end,
          unsigned_long *it,CoordinateOrder *internalCoordinateOrder,allocator_type *allocator)

{
  long lVar1;
  undefined8 uVar2;
  difference_type dVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  size_t *psVar6;
  size_t *end_00;
  size_t *strideBegin;
  size_t s;
  size_t j;
  allocator_type *allocator_local;
  CoordinateOrder *internalCoordinateOrder_local;
  unsigned_long *it_local;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  Geometry<std::allocator<unsigned_long>_> *this_local;
  
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this,allocator);
  dVar3 = std::distance<unsigned_long*>(begin,end);
  puVar4 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,dVar3 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar4;
  lVar1 = *(long *)(this + 8);
  dVar3 = std::distance<unsigned_long*>(begin,end);
  *(long *)(this + 0x10) = lVar1 + dVar3 * 8;
  lVar1 = *(long *)(this + 0x10);
  dVar3 = std::distance<unsigned_long*>(begin,end);
  *(long *)(this + 0x18) = lVar1 + dVar3 * 8;
  dVar3 = std::distance<unsigned_long*>(begin,end);
  *(difference_type *)(this + 0x20) = dVar3;
  *(undefined8 *)(this + 0x28) = 1;
  *(CoordinateOrder *)(this + 0x30) = *internalCoordinateOrder;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  sVar5 = Geometry<std::allocator<unsigned_long>_>::dimension
                    ((Geometry<std::allocator<unsigned_long>_> *)this);
  if (sVar5 != 0) {
    s = 0;
    internalCoordinateOrder_local = (CoordinateOrder *)it;
    end_local = begin;
    while( true ) {
      sVar5 = Geometry<std::allocator<unsigned_long>_>::dimension
                        ((Geometry<std::allocator<unsigned_long>_> *)this);
      if (sVar5 <= s) break;
      sVar5 = *end_local;
      psVar6 = Geometry<std::allocator<unsigned_long>_>::shape
                         ((Geometry<std::allocator<unsigned_long>_> *)this,s);
      *psVar6 = sVar5;
      psVar6 = Geometry<std::allocator<unsigned_long>_>::size
                         ((Geometry<std::allocator<unsigned_long>_> *)this);
      *psVar6 = *psVar6 * sVar5;
      uVar2 = *(undefined8 *)internalCoordinateOrder_local;
      psVar6 = Geometry<std::allocator<unsigned_long>_>::strides
                         ((Geometry<std::allocator<unsigned_long>_> *)this,s);
      *psVar6 = uVar2;
      s = s + 1;
      end_local = end_local + 1;
      internalCoordinateOrder_local = internalCoordinateOrder_local + 2;
    }
    psVar6 = Geometry<std::allocator<unsigned_long>_>::shapeBegin
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    end_00 = Geometry<std::allocator<unsigned_long>_>::shapeEnd
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    strideBegin = Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin
                            ((Geometry<std::allocator<unsigned_long>_> *)this);
    stridesFromShape<unsigned_long*,unsigned_long*>
              (psVar6,end_00,strideBegin,internalCoordinateOrder);
    Geometry<std::allocator<unsigned_long>_>::updateSimplicity
              ((Geometry<std::allocator<unsigned_long>_> *)this);
  }
  return;
}

Assistant:

inline
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    StrideIterator it,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension() != 0) {
        for(std::size_t j=0; j<dimension(); ++j, ++begin, ++it) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
            strides(j) = *it;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
        updateSimplicity();
    }
}